

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::filename(path *__return_storage_ptr__,path *this)

{
  bool bVar1;
  iterator *this_00;
  reference p;
  iterator local_60;
  path *local_18;
  path *this_local;
  
  local_18 = this;
  this_local = __return_storage_ptr__;
  bVar1 = has_relative_path(this);
  if (bVar1) {
    end(&local_60,this);
    this_00 = iterator::operator--(&local_60);
    p = iterator::operator*(this_00);
    path(__return_storage_ptr__,p);
    iterator::~iterator(&local_60);
  }
  else {
    path(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::filename() const
{
    return !has_relative_path() ? path() : path(*--end());
}